

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O2

void ngx_unescape_uri(u_char **dst,u_char **src,size_t size,ngx_uint_t type)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  byte bVar5;
  char cVar6;
  byte bVar7;
  bool bVar8;
  
  pbVar1 = *dst;
  pbVar4 = *src;
  bVar5 = 0;
  iVar3 = 0;
  do {
    bVar8 = size == 0;
    size = size - 1;
    if (bVar8) {
LAB_001179ac:
      *dst = pbVar1;
      *src = pbVar4;
      return;
    }
    bVar7 = *pbVar4;
    if (iVar3 == 2) {
      if ((byte)(bVar7 - 0x30) < 10) {
        cVar6 = bVar7 + bVar5 * '\x10';
        if (((type & 2) == 0) || ((byte)(cVar6 + 0xaaU) < 0x59)) {
          *pbVar1 = cVar6 - 0x30;
          goto LAB_00117922;
        }
        *pbVar1 = 0x25;
        pbVar1[1] = pbVar4[-1];
        pbVar1[2] = *pbVar4;
        pbVar1 = pbVar1 + 3;
        goto LAB_00117925;
      }
      iVar3 = 0;
      if ((byte)((bVar7 | 0x20) + 0x9f) < 6) {
        cVar6 = (bVar7 | 0x20) + bVar5 * '\x10';
        bVar7 = cVar6 + 0xa9;
        if ((type & 1) == 0) {
          if ((type & 2) != 0) {
            if (bVar7 == 0x3f) goto LAB_001179a3;
            if (0x58 < (byte)(cVar6 + 0x83U)) {
              *pbVar1 = 0x25;
              pbVar1[1] = pbVar4[-1];
              pbVar1[2] = *pbVar4;
              pbVar1 = pbVar1 + 3;
              goto LAB_00117927;
            }
          }
        }
        else if (bVar7 == 0x3f) {
LAB_001179a3:
          *pbVar1 = 0x3f;
          pbVar1 = pbVar1 + 1;
          pbVar4 = pbVar4 + 1;
          goto LAB_001179ac;
        }
        *pbVar1 = bVar7;
        pbVar1 = pbVar1 + 1;
      }
    }
    else if (iVar3 == 1) {
      bVar2 = bVar7 - 0x30;
      if (9 < bVar2) {
        if (5 < (byte)((bVar7 | 0x20) + 0x9f)) goto LAB_0011791f;
        bVar2 = (bVar7 | 0x20) + 0xa9;
      }
      iVar3 = 2;
      bVar5 = bVar2;
    }
    else {
      if ((type & 3) != 0 && bVar7 == 0x3f) goto LAB_001179a3;
      if (bVar7 == 0x25) {
        iVar3 = 1;
        goto LAB_00117927;
      }
LAB_0011791f:
      *pbVar1 = bVar7;
LAB_00117922:
      pbVar1 = pbVar1 + 1;
LAB_00117925:
      iVar3 = 0;
    }
LAB_00117927:
    pbVar4 = pbVar4 + 1;
  } while( true );
}

Assistant:

void
ngx_unescape_uri(u_char **dst, u_char **src, size_t size, ngx_uint_t type)
{
    u_char  *d, *s, ch, c, decoded;
    enum {
        sw_usual = 0,
        sw_quoted,
        sw_quoted_second
    } state;

    d = *dst;
    s = *src;

    state = 0;
    decoded = 0;

    while (size--) {

        ch = *s++;

        switch (state) {
        case sw_usual:
            if (ch == '?'
                && (type & (NGX_UNESCAPE_URI|NGX_UNESCAPE_REDIRECT)))
            {
                *d++ = ch;
                goto done;
            }

            if (ch == '%') {
                state = sw_quoted;
                break;
            }

            *d++ = ch;
            break;

        case sw_quoted:

            if (ch >= '0' && ch <= '9') {
                decoded = (u_char) (ch - '0');
                state = sw_quoted_second;
                break;
            }

            c = (u_char) (ch | 0x20);
            if (c >= 'a' && c <= 'f') {
                decoded = (u_char) (c - 'a' + 10);
                state = sw_quoted_second;
                break;
            }

            /* the invalid quoted character */

            state = sw_usual;

            *d++ = ch;

            break;

        case sw_quoted_second:

            state = sw_usual;

            if (ch >= '0' && ch <= '9') {
                ch = (u_char) ((decoded << 4) + ch - '0');

                if (type & NGX_UNESCAPE_REDIRECT) {
                    if (ch > '%' && ch < 0x7f) {
                        *d++ = ch;
                        break;
                    }

                    *d++ = '%'; *d++ = *(s - 2); *d++ = *(s - 1);

                    break;
                }

                *d++ = ch;

                break;
            }

            c = (u_char) (ch | 0x20);
            if (c >= 'a' && c <= 'f') {
                ch = (u_char) ((decoded << 4) + c - 'a' + 10);

                if (type & NGX_UNESCAPE_URI) {
                    if (ch == '?') {
                        *d++ = ch;
                        goto done;
                    }

                    *d++ = ch;
                    break;
                }

                if (type & NGX_UNESCAPE_REDIRECT) {
                    if (ch == '?') {
                        *d++ = ch;
                        goto done;
                    }

                    if (ch > '%' && ch < 0x7f) {
                        *d++ = ch;
                        break;
                    }

                    *d++ = '%'; *d++ = *(s - 2); *d++ = *(s - 1);
                    break;
                }

                *d++ = ch;

                break;
            }

            /* the invalid quoted character */

            break;
        }
    }

done:

    *dst = d;
    *src = s;
}